

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::TryGenerateFastBrSrXx
          (Lowerer *this,Instr *instr,RegOpnd *srcReg1,RegOpnd *srcReg2,Instr **pInstrPrev,
          bool noMathFastPath)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  Opnd *constOpnd;
  char *this_00;
  
  this_00 = (char *)instr;
  bVar2 = IR::Instr::IsNeq(instr);
  if ((srcReg2 == (RegOpnd *)0x0) || (bVar3 = IsConstRegOpnd((Lowerer *)this_00,srcReg2), !bVar3)) {
    if ((srcReg1 == (RegOpnd *)0x0) || (bVar3 = IsConstRegOpnd((Lowerer *)this_00,srcReg1), !bVar3))
    {
      return false;
    }
    this_00 = (char *)instr;
    IR::Instr::SwapOpnds(instr);
    srcReg2 = srcReg1;
    if (instr->m_kind == InstrKindBranch) goto LAB_005c1a22;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl";
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
  }
  else {
    if (instr->m_kind == InstrKindBranch) goto LAB_005c1a22;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    this_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl";
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
  }
  if (!bVar3) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_005c1a22:
  constOpnd = GetConstRegOpnd((Lowerer *)this_00,srcReg2,instr);
  GenerateFastBrConst(this,(BranchInstr *)instr,constOpnd,!bVar2);
  IR::Instr::Remove(instr);
  return true;
}

Assistant:

bool
Lowerer::TryGenerateFastBrSrXx(IR::Instr * instr, IR::RegOpnd * srcReg1, IR::RegOpnd * srcReg2, IR::Instr ** pInstrPrev, bool noMathFastPath)
{
    bool isEqual = !instr->IsNeq();

    if (srcReg2 && IsConstRegOpnd(srcReg2))
    {
        this->GenerateFastBrConst(instr->AsBranchInstr(), GetConstRegOpnd(srcReg2, instr), isEqual);
        instr->Remove();
        return true;
    }
    else if (srcReg1 && IsConstRegOpnd(srcReg1))
    {
        instr->SwapOpnds();
        this->GenerateFastBrConst(instr->AsBranchInstr(), GetConstRegOpnd(srcReg1, instr), isEqual);
        instr->Remove();
        return true;
    }

    return false;
}